

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTAircraft.cpp
# Opt level: O2

void __thiscall LTAircraft::LTAircraft(LTAircraft *this,LTFlightData *inFd)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ulong uVar2;
  pointer pcVar3;
  bool bVar4;
  int newCycle;
  FlightModel *pFVar5;
  Doc8643 *pDVar6;
  string *psVar7;
  char *pcVar8;
  recursive_mutex *__mutex;
  XPMPPlaneID _modeS_id;
  long lVar9;
  allocator<char> local_6d4;
  allocator<char> local_6d3;
  allocator<char> local_6d2;
  allocator<char> local_6d1;
  dequePositionTy *local_6d0;
  string local_6c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6a8;
  char *local_688;
  size_type local_680;
  char local_678 [8];
  undefined8 uStack_670;
  string local_668;
  string local_648;
  string local_628;
  string local_608;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5e8;
  char *local_5c8;
  size_type local_5c0;
  char local_5b8 [8];
  undefined8 uStack_5b0;
  string local_5a8;
  string local_588;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_568;
  string local_548;
  initializer_list<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_528;
  initializer_list<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_518;
  initializer_list<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_508;
  FDStaticData statCopy;
  FDStaticData local_360;
  FDDynamicData dynCopy;
  
  std::__cxx11::string::string((string *)&local_5e8,(string *)&dataRefs.cslFixAcIcaoType);
  LTFlightData::WaitForSafeCopyStat(&statCopy,inFd);
  local_5c8 = local_5b8;
  paVar1 = &statCopy.acTypeIcao.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)statCopy.acTypeIcao._M_dataplus._M_p == paVar1) {
    uStack_5b0 = statCopy.acTypeIcao.field_2._8_8_;
  }
  else {
    local_5c8 = statCopy.acTypeIcao._M_dataplus._M_p;
  }
  local_5c0 = statCopy.acTypeIcao._M_string_length;
  statCopy.acTypeIcao._M_string_length = 0;
  statCopy.acTypeIcao.field_2._M_local_buf[0] = '\0';
  local_508._M_len = 2;
  local_508._M_array = &local_5e8;
  statCopy.acTypeIcao._M_dataplus._M_p = (pointer)paVar1;
  str_first_non_empty(&local_5a8,&local_508);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_588,local_5a8._M_dataplus._M_p,&local_6d1);
  std::__cxx11::string::string((string *)&local_568,(string *)&dataRefs.cslFixOpIcao);
  LTFlightData::WaitForSafeCopyStat((FDStaticData *)&dynCopy,inFd);
  LTFlightData::FDStaticData::airlineCode_abi_cxx11_(&local_548,(FDStaticData *)&dynCopy);
  local_518._M_len = 2;
  local_518._M_array = &local_568;
  str_first_non_empty(&local_628,&local_518);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_608,local_628._M_dataplus._M_p,&local_6d2);
  std::__cxx11::string::string((string *)&local_6a8,(string *)&dataRefs.cslFixLivery);
  LTFlightData::WaitForSafeCopyStat(&local_360,inFd);
  local_688 = local_678;
  paVar1 = &local_360.reg.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_360.reg._M_dataplus._M_p == paVar1) {
    uStack_670 = local_360.reg.field_2._8_8_;
  }
  else {
    local_688 = local_360.reg._M_dataplus._M_p;
  }
  local_680 = local_360.reg._M_string_length;
  local_360.reg._M_string_length = 0;
  local_360.reg.field_2._M_local_buf[0] = '\0';
  local_528._M_len = 2;
  local_528._M_array = &local_6a8;
  local_360.reg._M_dataplus._M_p = (pointer)paVar1;
  str_first_non_empty(&local_668,&local_528);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_648,local_668._M_dataplus._M_p,&local_6d3);
  uVar2 = (inFd->acKey).num;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_6c8,"",&local_6d4);
  _modeS_id = (XPMPPlaneID)uVar2;
  if (0xfffffe < uVar2) {
    _modeS_id = 0;
  }
  XPMP2::Aircraft::Aircraft
            (&this->super_Aircraft,&local_588,&local_608,&local_648,_modeS_id,&local_6c8);
  std::__cxx11::string::~string((string *)&local_6c8);
  std::__cxx11::string::~string((string *)&local_648);
  std::__cxx11::string::~string((string *)&local_668);
  lVar9 = 0x20;
  do {
    std::__cxx11::string::~string((string *)((long)&local_6a8._M_dataplus._M_p + lVar9));
    lVar9 = lVar9 + -0x20;
  } while (lVar9 != -0x20);
  LTFlightData::FDStaticData::~FDStaticData(&local_360);
  std::__cxx11::string::~string((string *)&local_608);
  std::__cxx11::string::~string((string *)&local_628);
  lVar9 = 0x20;
  do {
    std::__cxx11::string::~string((string *)((long)&local_568._M_dataplus._M_p + lVar9));
    lVar9 = lVar9 + -0x20;
  } while (lVar9 != -0x20);
  LTFlightData::FDStaticData::~FDStaticData((FDStaticData *)&dynCopy);
  std::__cxx11::string::~string((string *)&local_588);
  std::__cxx11::string::~string((string *)&local_5a8);
  lVar9 = 0x20;
  do {
    std::__cxx11::string::~string((string *)((long)&local_5e8._M_dataplus._M_p + lVar9));
    lVar9 = lVar9 + -0x20;
  } while (lVar9 != -0x20);
  LTFlightData::FDStaticData::~FDStaticData(&statCopy);
  (this->super_Aircraft)._vptr_Aircraft = (_func_int **)&PTR__LTAircraft_002bb708;
  this->fd = inFd;
  pFVar5 = FlightModel::FindFlightModel(inFd,true,(string **)0x0);
  this->pMdl = pFVar5;
  pDVar6 = Doc8643::get(&(this->super_Aircraft).acIcaoType);
  this->pDoc8643 = pDVar6;
  this->bStaticObject = false;
  std::_Deque_base<positionTy,_std::allocator<positionTy>_>::_Deque_base
            (&(this->posList).super__Deque_base<positionTy,_std::allocator<positionTy>_>);
  (this->labelInternal)._M_dataplus._M_p = (pointer)&(this->labelInternal).field_2;
  (this->labelInternal)._M_string_length = 0;
  (this->labelInternal).field_2._M_local_buf[0] = '\0';
  positionTy::positionTy(&this->ppos);
  (this->vec).angle = NAN;
  (this->vec).dist = NAN;
  (this->vec).vsi = NAN;
  (this->vec).speed = NAN;
  this->tsLastCalcRequested = 0.0;
  this->phase = FPH_UNKNOWN;
  this->rotateTs = NAN;
  this->vsi = 0.0;
  *(undefined4 *)((long)&this->vsi + 7) = 0;
  AccelParam::AccelParam(&this->speed);
  local_6d0 = &this->posList;
  BezierCurve::BezierCurve(&this->turn);
  MovingParam::MovingParam(&this->heading,this->pMdl->TAXI_TURN_TIME,360.0,0.0,true);
  MovingParam::MovingParam(&this->corrAngle,this->pMdl->FLIGHT_TURN_TIME * 0.5,90.0,-90.0,false);
  MovingParam::MovingParam(&this->gear,this->pMdl->GEAR_DURATION,1.0,0.0,false);
  MovingParam::MovingParam(&this->flaps,this->pMdl->FLAPS_DURATION,1.0,0.0,false);
  pFVar5 = this->pMdl;
  MovingParam::MovingParam
            (&this->pitch,(pFVar5->PITCH_MAX - pFVar5->PITCH_MIN) / pFVar5->PITCH_RATE,
             pFVar5->PITCH_MAX,pFVar5->PITCH_MIN,false);
  MovingParam::MovingParam(&this->reversers,2.0,1.0,0.0,false);
  MovingParam::MovingParam(&this->spoilers,0.5,1.0,0.0,false);
  MovingParam::MovingParam(&this->tireRpm,5.0,2000.0,0.0,false);
  MovingParam::MovingParam(&this->gearDeflection,0.5,this->pMdl->GEAR_DEFLECTION,0.0,false);
  this->probeNextTs = 0.0;
  this->terrainAlt_m = 0.0;
  (this->vecView).angle = NAN;
  (this->vecView).dist = NAN;
  (this->vecView).vsi = NAN;
  (this->vecView).speed = NAN;
  this->bChangeModel = false;
  this->bSendNewInfoData = false;
  this->bSetVisible = true;
  this->bAutoVisible = true;
  (this->nearestAirport)._M_dataplus._M_p = (pointer)&(this->nearestAirport).field_2;
  (this->nearestAirport)._M_string_length = 0;
  (this->nearestAirport).field_2._M_local_buf[0] = '\0';
  positionTy::positionTy(&this->nearestAirportPos);
  this->lastNearestAirportCheck = 0.0;
  newCycle = XPLMGetCycleNumber();
  if (newCycle != currCycle.num) {
    NextCycle(newCycle);
  }
  __mutex = &this->fd->dataAccessMutex;
  std::recursive_mutex::lock(__mutex);
  LTFlightData::WaitForSafeCopyDyn(&dynCopy,this->fd,true);
  LTFlightData::WaitForSafeCopyStat(&statCopy,this->fd);
  bVar4 = LTFlightData::FDStaticData::isStaticObject(&statCopy);
  this->bStaticObject = bVar4;
  (this->super_Aircraft).aiPrio = 0;
  (this->super_Aircraft).bClampToGround = false;
  (this->super_Aircraft).acRadar.size = dynCopy.radar.size;
  (this->super_Aircraft).acRadar.code = dynCopy.radar.code;
  (this->super_Aircraft).acRadar.mode = dynCopy.radar.mode;
  LabelUpdate(this);
  CalcLabelInternal(this,&statCopy);
  MovingParam::SetVal(&this->pitch,0.0);
  MovingParam::SetVal(&this->corrAngle,0.0);
  bVar4 = CalcPPos(this);
  if (!bVar4 && (int)dataRefs.iLogLevel < 4) {
    LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTAircraft.cpp"
           ,0x514,"LTAircraft",logERR,"Could not calculate position when creating aircraft %s",
           (this->fd->acKey).key._M_dataplus._M_p);
  }
  if ((this->super_Aircraft).bOnGrnd == true) {
    MovingParam::SetVal(&this->gear,(this->gear).defMax);
    MovingParam::SetVal(&this->gearDeflection,
                        ((this->gearDeflection).defMin + (this->gearDeflection).defMax) * 0.5);
  }
  DataRefs::IncNumAc(&dataRefs);
  if ((int)dataRefs.iLogLevel < 2) {
    pcVar3 = (this->labelInternal)._M_dataplus._M_p;
    psVar7 = XPMP2::Aircraft::GetModelName_abi_cxx11_(&this->super_Aircraft);
    if (dynCopy.pChannel == (LTChannel *)0x0) {
      pcVar8 = "?";
    }
    else {
      pcVar8 = (dynCopy.pChannel)->pszChName;
    }
    LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTAircraft.cpp"
           ,0x524,"LTAircraft",logINFO,
           "Added aircraft %s, operator \'%s\', a/c model \'%s\', flight model [%s], bearing %.0f, distance %.1fnm, from channel %s"
           ,(this->vecView).angle,(this->vecView).dist / 1852.0,pcVar3,
           statCopy.opIcao._M_dataplus._M_p,(psVar7->_M_dataplus)._M_p,
           (this->pMdl->modelName)._M_dataplus._M_p,pcVar8);
  }
  LTFlightData::FDStaticData::~FDStaticData(&statCopy);
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  return;
}

Assistant:

LTAircraft::LTAircraft(LTFlightData& inFd) :
// Base class -> this registers with XPMP API for actual display in XP!
// repeated calls to WaitForSafeCopyStat look inefficient, but if the lock is held by the calling function already then these are quick recursive calls
// Using registration as livery indicator, allows for different liveries per actual airframe
// Debug options to set fixed type/op/livery take precedence
XPMP2::Aircraft(str_first_non_empty({dataRefs.cslFixAcIcaoType, inFd.WaitForSafeCopyStat().acTypeIcao}).c_str(),
                str_first_non_empty({dataRefs.cslFixOpIcao,     inFd.WaitForSafeCopyStat().airlineCode()}).c_str(),
                str_first_non_empty({dataRefs.cslFixLivery,     inFd.WaitForSafeCopyStat().reg}).c_str(),
                inFd.key().num < MAX_MODE_S_ID ? (XPMPPlaneID)inFd.key().num : 0),      // OGN Ids can be larger than MAX_MODE_S_ID, in that case let XPMP2 assign a synthetic id
// class members
fd(inFd),
pMdl(&FlightModel::FindFlightModel(inFd, true)),      // find matching flight model
pDoc8643(&Doc8643::get(acIcaoType)),
tsLastCalcRequested(0),
phase(FPH_UNKNOWN),
rotateTs(NAN),
vsi(0.0),
bArtificalPos(false),
heading(pMdl->TAXI_TURN_TIME, 360, 0, true),
corrAngle(pMdl->FLIGHT_TURN_TIME / 2.0, 90, -90, false),
gear(pMdl->GEAR_DURATION),
flaps(pMdl->FLAPS_DURATION),
pitch((pMdl->PITCH_MAX-pMdl->PITCH_MIN)/pMdl->PITCH_RATE, pMdl->PITCH_MAX, pMdl->PITCH_MIN),
reversers(MDL_REVERSERS_TIME),
spoilers(MDL_SPOILERS_TIME),
tireRpm(MDL_TIRE_SLOW_TIME, MDL_TIRE_MAX_RPM),
gearDeflection(MDL_GEAR_DEFL_TIME, pMdl->GEAR_DEFLECTION),
probeNextTs(0), terrainAlt_m(0.0)
{
    // for some calcs we need correct timestamps _before_ first draw already
    // so make sure the currCycle struct is up-to-date
    int cycle = XPLMGetCycleNumber();
    if ( cycle != currCycle.num )            // new cycle!
        NextCycle(cycle);

    try {
        // access guarded by a mutex (will be a recursive call: creator/caller should be holding the lock already)
        std::lock_guard<std::recursive_mutex> lock (fd.dataAccessMutex);
        
        // get copy of dynamice and static data for constructor purposes
        LTFlightData::FDDynamicData dynCopy (fd.WaitForSafeCopyDyn());
        LTFlightData::FDStaticData statCopy (fd.WaitForSafeCopyStat());
        bStaticObject = statCopy.isStaticObject();
        
        // init
        aiPrio = 0;
        bClampToGround = false;
        
        // positional data / radar: just copy from fd for a start
        acRadar = dynCopy.radar;

        // standard label
        LabelUpdate();

        // standard internal label (e.g. for logging) is transpIcao + ac type + another id if available
        CalcLabelInternal(statCopy);
        
        // init moving params where necessary
        pitch.SetVal(0);
        corrAngle.SetVal(0);
        
        // calculate our first position, must also succeed
        if (!CalcPPos())
            LOG_MSG(logERR,ERR_AC_CALC_PPOS,fd.key().c_str());
        
        // if we start on the ground then have the gear out already
        if (IsOnGrnd()) {
            gear.SetVal(gear.defMax);
            gearDeflection.SetVal((gearDeflection.defMin+gearDeflection.defMax)/2);
        }
        
        // tell the world we've added something
        dataRefs.IncNumAc();
        LOG_MSG(logINFO,INFO_AC_ADDED,
                labelInternal.c_str(),
                statCopy.opIcao.c_str(),
                GetModelName().c_str(),
                pMdl->modelName.c_str(),
                vecView.angle, vecView.dist/M_per_NM,
                dynCopy.pChannel ? dynCopy.pChannel->ChName() : "?");
        
    } catch(const std::system_error& e) {
        LOG_MSG(logERR, ERR_LOCK_ERROR, key().c_str(), e.what());
    }
}